

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCl.c
# Opt level: O0

Gia_Man_t * Acec_RewriteReplace(Gia_Man_t *p,Vec_Int_t *vRes)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  bool bVar7;
  Gia_Obj_t *pRepr;
  int iLit;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Int_t *vRes_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManCoNum(p);
  iVar2 = Vec_IntSize(vRes);
  if (iVar1 != iVar2) {
    __assert_fail("Gia_ManCoNum(p) == Vec_IntSize(vRes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCl.c"
                  ,0x186,"Gia_Man_t *Acec_RewriteReplace(Gia_Man_t *, Vec_Int_t *)");
  }
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  Gia_ManFillValue(p);
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  pRepr._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar7 = false;
    if (pRepr._4_4_ < iVar1) {
      _iLit = Gia_ManCi(p,pRepr._4_4_);
      bVar7 = _iLit != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar3 = Gia_ManAppendCi(p_00);
    _iLit->Value = uVar3;
    pRepr._4_4_ = pRepr._4_4_ + 1;
  }
  pRepr._4_4_ = 0;
  while( true ) {
    bVar7 = false;
    if (pRepr._4_4_ < p->nObjs) {
      _iLit = Gia_ManObj(p,pRepr._4_4_);
      bVar7 = _iLit != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjIsAnd(_iLit);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(_iLit);
      iVar2 = Gia_ObjFanin1Copy(_iLit);
      uVar3 = Gia_ManAppendAnd(p_00,iVar1,iVar2);
      _iLit->Value = uVar3;
    }
    pRepr._4_4_ = pRepr._4_4_ + 1;
  }
  pRepr._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar7 = false;
    if (pRepr._4_4_ < iVar1) {
      _iLit = Gia_ManCo(p,pRepr._4_4_);
      bVar7 = _iLit != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Vec_IntEntry(vRes,pRepr._4_4_);
    iVar1 = Abc_Lit2Var(iVar1);
    pGVar5 = Gia_ManObj(p,iVar1);
    uVar3 = Gia_ManAppendCo(p_00,pGVar5->Value);
    _iLit->Value = uVar3;
    pRepr._4_4_ = pRepr._4_4_ + 1;
  }
  Gia_ManSetPhase(p);
  Gia_ManSetPhase(p_00);
  pRepr._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p_00->vCos);
    bVar7 = false;
    if (pRepr._4_4_ < iVar1) {
      _iLit = Gia_ManCo(p_00,pRepr._4_4_);
      bVar7 = _iLit != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjPhase(_iLit);
    pGVar5 = Gia_ManCo(p,pRepr._4_4_);
    iVar2 = Gia_ObjPhase(pGVar5);
    if (iVar1 != iVar2) {
      Gia_ObjFlipFaninC0(_iLit);
    }
    pRepr._4_4_ = pRepr._4_4_ + 1;
  }
  pGVar6 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar6;
}

Assistant:

Gia_Man_t * Acec_RewriteReplace( Gia_Man_t * p, Vec_Int_t * vRes )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;  int i;
    assert( Gia_ManCoNum(p) == Vec_IntSize(vRes) );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
    {
        int iLit = Vec_IntEntry( vRes, i );
        Gia_Obj_t * pRepr = Gia_ManObj( p, Abc_Lit2Var(iLit) );
        pObj->Value = Gia_ManAppendCo( pNew, pRepr->Value );
    }
    // set correct phase
    Gia_ManSetPhase( p );
    Gia_ManSetPhase( pNew );
    Gia_ManForEachCo( pNew, pObj, i )
        if ( Gia_ObjPhase(pObj) != Gia_ObjPhase(Gia_ManCo(p, i)) )
            Gia_ObjFlipFaninC0( pObj );
    // remove dangling nodes
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}